

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O1

bool parseModeline(QByteArray *text,drmModeModeInfoPtr mode)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  float fclock;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = -0x55555556;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58 = -0x55555556;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  fclock = -NAN;
  mode->type = 0x20;
  bVar4 = false;
  mode->hskew = 0;
  mode->vscan = 0;
  mode->vrefresh = 0;
  mode->flags = 0;
  pcVar5 = (text->d).ptr;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = (char *)&QByteArray::_empty;
  }
  iVar1 = __isoc99_sscanf(pcVar5,"%f %hd %hd %hd %hd %hd %hd %hd %hd %15s %15s",&fclock,
                          &mode->hdisplay,&mode->hsync_start,&mode->hsync_end,&mode->htotal,
                          &mode->vdisplay,&mode->vsync_start,&mode->vsync_end,&mode->vtotal,
                          &local_48,&local_58);
  if (iVar1 != 0xb) goto LAB_00134fcd;
  mode->clock = (uint32_t)(long)(fclock * 1000.0);
  if (CONCAT31((undefined3)uStack_44,local_48._3_1_) == 0x636e79 && local_48 == 0x7973682b) {
    uVar2 = 1;
LAB_00134f88:
    uVar2 = uVar2 | mode->flags;
    mode->flags = uVar2;
    if (CONCAT31((undefined3)uStack_54,local_58._3_1_) == 0x636e79 && local_58 == 0x7973762b) {
      uVar3 = 4;
    }
    else {
      if (CONCAT31((undefined3)uStack_54,local_58._3_1_) != 0x636e79 || local_58 != 0x7973762d)
      goto LAB_00134fb5;
      uVar3 = 8;
    }
    mode->flags = uVar2 | uVar3;
    bVar4 = true;
  }
  else {
    if (CONCAT31((undefined3)uStack_44,local_48._3_1_) == 0x636e79 && local_48 == 0x7973682d) {
      uVar2 = 2;
      goto LAB_00134f88;
    }
LAB_00134fb5:
    bVar4 = false;
  }
LAB_00134fcd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

static bool parseModeline(const QByteArray &text, drmModeModeInfoPtr mode)
{
    char hsync[16];
    char vsync[16];
    float fclock;

    mode->type = DRM_MODE_TYPE_USERDEF;
    mode->hskew = 0;
    mode->vscan = 0;
    mode->vrefresh = 0;
    mode->flags = 0;

    if (sscanf(text.constData(), "%f %hd %hd %hd %hd %hd %hd %hd %hd %15s %15s",
               &fclock,
               &mode->hdisplay,
               &mode->hsync_start,
               &mode->hsync_end,
               &mode->htotal,
               &mode->vdisplay,
               &mode->vsync_start,
               &mode->vsync_end,
               &mode->vtotal, hsync, vsync) != 11)
        return false;

    mode->clock = fclock * 1000;

    if (strcmp(hsync, "+hsync") == 0)
        mode->flags |= DRM_MODE_FLAG_PHSYNC;
    else if (strcmp(hsync, "-hsync") == 0)
        mode->flags |= DRM_MODE_FLAG_NHSYNC;
    else
        return false;

    if (strcmp(vsync, "+vsync") == 0)
        mode->flags |= DRM_MODE_FLAG_PVSYNC;
    else if (strcmp(vsync, "-vsync") == 0)
        mode->flags |= DRM_MODE_FLAG_NVSYNC;
    else
        return false;

    return true;
}